

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O0

xxh_u64 XXH64_endian_align(xxh_u8 *input,size_t len,xxh_u64 seed,XXH_alignment align)

{
  xxh_u64 xVar1;
  xxh_u8 *pxVar2;
  xxh_u8 *pxVar3;
  xxh_u8 *pxVar4;
  xxh_u8 *pxVar5;
  xxh_u8 *in_RDX;
  ulong in_RSI;
  ulong in_RDI;
  xxh_u64 v4;
  xxh_u64 v3;
  xxh_u64 v2;
  xxh_u64 v1;
  xxh_u8 *limit;
  xxh_u8 *bEnd;
  xxh_u64 h64;
  undefined8 in_stack_ffffffffffffff88;
  XXH_alignment align_00;
  xxh_u8 *in_stack_ffffffffffffff90;
  xxh_u8 *in_stack_ffffffffffffff98;
  xxh_u8 *in_stack_ffffffffffffffa0;
  xxh_u8 *local_58;
  xxh_u8 *local_50;
  xxh_u8 *local_48;
  xxh_u8 *local_40;
  ulong local_8;
  
  align_00 = (XXH_alignment)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  local_48 = in_stack_ffffffffffffff90;
  local_50 = in_stack_ffffffffffffff98;
  local_58 = in_stack_ffffffffffffffa0;
  if (0x1f < in_RSI) {
    pxVar5 = in_RDX + 0x61c8864e7a143579;
    pxVar4 = in_RDX;
    pxVar3 = in_RDX + -0x3d4d51c2d82b14b1;
    pxVar2 = in_RDX + 0x60ea27eeadc0b5d6;
    local_8 = in_RDI;
    do {
      local_40 = pxVar2;
      local_48 = pxVar3;
      local_50 = pxVar4;
      local_58 = pxVar5;
      xVar1 = XXH_readLE64_align(local_40,XXH_aligned);
      pxVar2 = (xxh_u8 *)XXH64_round((xxh_u64)local_40,xVar1);
      xVar1 = XXH_readLE64_align(local_40,XXH_aligned);
      pxVar3 = (xxh_u8 *)XXH64_round((xxh_u64)local_48,xVar1);
      xVar1 = XXH_readLE64_align(local_40,XXH_aligned);
      pxVar4 = (xxh_u8 *)XXH64_round((xxh_u64)local_50,xVar1);
      xVar1 = XXH_readLE64_align(local_40,XXH_aligned);
      pxVar5 = (xxh_u8 *)XXH64_round((xxh_u64)local_58,xVar1);
      local_8 = local_8 + 0x20;
    } while (local_8 < (in_RDI + in_RSI) - 0x1f);
    XXH64_mergeRound((xxh_u64)local_48,(xxh_u64)local_40);
    XXH64_mergeRound((xxh_u64)local_48,(xxh_u64)local_40);
    XXH64_mergeRound((xxh_u64)local_48,(xxh_u64)local_40);
    XXH64_mergeRound((xxh_u64)local_48,(xxh_u64)local_40);
    align_00 = (XXH_alignment)((ulong)local_40 >> 0x20);
  }
  xVar1 = XXH64_finalize((xxh_u64)local_58,local_50,(size_t)local_48,align_00);
  return xVar1;
}

Assistant:

XXH_FORCE_INLINE XXH_PUREF xxh_u64
XXH64_endian_align(const xxh_u8* input, size_t len, xxh_u64 seed, XXH_alignment align)
{
    xxh_u64 h64;
    if (input==NULL) XXH_ASSERT(len == 0);

    if (len>=32) {
        const xxh_u8* const bEnd = input + len;
        const xxh_u8* const limit = bEnd - 31;
        xxh_u64 v1 = seed + XXH_PRIME64_1 + XXH_PRIME64_2;
        xxh_u64 v2 = seed + XXH_PRIME64_2;
        xxh_u64 v3 = seed + 0;
        xxh_u64 v4 = seed - XXH_PRIME64_1;

        do {
            v1 = XXH64_round(v1, XXH_get64bits(input)); input+=8;
            v2 = XXH64_round(v2, XXH_get64bits(input)); input+=8;
            v3 = XXH64_round(v3, XXH_get64bits(input)); input+=8;
            v4 = XXH64_round(v4, XXH_get64bits(input)); input+=8;
        } while (input<limit);

        h64 = XXH_rotl64(v1, 1) + XXH_rotl64(v2, 7) + XXH_rotl64(v3, 12) + XXH_rotl64(v4, 18);
        h64 = XXH64_mergeRound(h64, v1);
        h64 = XXH64_mergeRound(h64, v2);
        h64 = XXH64_mergeRound(h64, v3);
        h64 = XXH64_mergeRound(h64, v4);

    } else {
        h64  = seed + XXH_PRIME64_5;
    }

    h64 += (xxh_u64) len;

    return XXH64_finalize(h64, input, len, align);
}